

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsEffectSource::draw(QGraphicsEffectSource *this,QPainter *painter)

{
  QGraphicsEffectSourcePrivate *pQVar1;
  ulong uVar2;
  void *__src;
  QPoint *in_RSI;
  QPainter *in_RDI;
  long in_FS_OFFSET;
  QGraphicsEffectSourcePrivate *d;
  QPixmap pm;
  QTransform restoreTransform;
  QPoint *p;
  QPainter *this_00;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar1 = d_func((QGraphicsEffectSource *)0x4a33d5);
  local_c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&local_c0);
  uVar2 = QPixmapCache::find(&pQVar1->m_cacheKey,(QPixmap *)&local_c0);
  if ((uVar2 & 1) == 0) {
    pQVar1 = d_func((QGraphicsEffectSource *)0x4a34e0);
    (**(code **)(*(long *)pQVar1 + 0x50))(pQVar1,in_RSI);
  }
  else {
    memcpy(local_58,&DAT_00b0d660,0x50);
    QTransform::QTransform((QTransform *)in_RDI);
    p = in_RSI;
    if (pQVar1->m_cachedSystem == DeviceCoordinates) {
      __src = (void *)QPainter::worldTransform();
      memcpy(local_58,__src,0x4a);
      p = in_RSI;
      QTransform::QTransform((QTransform *)in_RDI);
      QPainter::setWorldTransform((QTransform *)in_RSI,SUB81(local_a8,0));
    }
    QPainter::drawPixmap(this_00,p,(QPixmap *)pQVar1);
    if (pQVar1->m_cachedSystem == DeviceCoordinates) {
      QPainter::setWorldTransform((QTransform *)p,SUB81(local_58,0));
    }
  }
  QPixmap::~QPixmap((QPixmap *)&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsEffectSource::draw(QPainter *painter)
{
    Q_D(const QGraphicsEffectSource);

    QPixmap pm;
    if (QPixmapCache::find(d->m_cacheKey, &pm)) {
        QTransform restoreTransform;
        if (d->m_cachedSystem == Qt::DeviceCoordinates) {
            restoreTransform = painter->worldTransform();
            painter->setWorldTransform(QTransform());
        }

        painter->drawPixmap(d->m_cachedOffset, pm);

        if (d->m_cachedSystem == Qt::DeviceCoordinates)
            painter->setWorldTransform(restoreTransform);
    } else {
        d_func()->draw(painter);
    }
}